

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::anon_unknown_0::BlockSingleNestedStructCase::BlockSingleNestedStructCase
          (BlockSingleNestedStructCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  StructType *pSVar1;
  BufferBlock *pBVar2;
  VarType local_248;
  BufferVar local_230;
  VarType local_1f0;
  BufferVar local_1d8;
  VarType local_198;
  BufferVar local_180;
  VarType local_140;
  BufferVar local_128;
  BufferBlock *local_e8;
  BufferBlock *block;
  VarType local_c8;
  StructType *local_b0;
  StructType *typeT;
  VarType local_90;
  VarType local_78;
  VarType local_60;
  StructType *local_38;
  StructType *typeS;
  BufferMode bufferMode_local;
  deUint32 layoutFlags_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  BlockSingleNestedStructCase *this_local;
  
  typeS._0_4_ = bufferMode;
  typeS._4_4_ = layoutFlags;
  _bufferMode_local = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,description,bufferMode,matrixLoadFlag);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockSingleNestedStructCase_016ac860;
  this->m_layoutFlags = typeS._4_4_;
  this->m_numInstances = numInstances;
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_38 = pSVar1;
  glu::VarType::VarType(&local_60,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_60);
  glu::VarType::~VarType(&local_60);
  pSVar1 = local_38;
  glu::VarType::VarType(&local_90,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_78,&local_90,4);
  glu::StructType::addMember(pSVar1,"b",&local_78);
  glu::VarType::~VarType(&local_78);
  glu::VarType::~VarType(&local_90);
  pSVar1 = local_38;
  glu::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&typeT);
  glu::VarType::~VarType((VarType *)&typeT);
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"T");
  local_b0 = pSVar1;
  glu::VarType::VarType(&local_c8,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::StructType::addMember(pSVar1,"a",&local_c8);
  glu::VarType::~VarType(&local_c8);
  pSVar1 = local_b0;
  glu::VarType::VarType((VarType *)&block,local_38);
  glu::StructType::addMember(pSVar1,"b",(VarType *)&block);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_e8 = pBVar2;
  glu::VarType::VarType(&local_140,local_38);
  BufferVar::BufferVar(&local_128,"s",&local_140,0x200);
  BufferBlock::addMember(pBVar2,&local_128);
  BufferVar::~BufferVar(&local_128);
  glu::VarType::~VarType(&local_140);
  pBVar2 = local_e8;
  glu::VarType::VarType(&local_198,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  BufferVar::BufferVar(&local_180,"v",&local_198,0);
  BufferBlock::addMember(pBVar2,&local_180);
  BufferVar::~BufferVar(&local_180);
  glu::VarType::~VarType(&local_198);
  pBVar2 = local_e8;
  glu::VarType::VarType(&local_1f0,local_b0);
  BufferVar::BufferVar(&local_1d8,"t",&local_1f0,0x600);
  BufferBlock::addMember(pBVar2,&local_1d8);
  BufferVar::~BufferVar(&local_1d8);
  glu::VarType::~VarType(&local_1f0);
  pBVar2 = local_e8;
  glu::VarType::VarType(&local_248,TYPE_UINT,PRECISION_HIGHP);
  BufferVar::BufferVar(&local_230,"u",&local_248,0x400);
  BufferBlock::addMember(pBVar2,&local_230);
  BufferVar::~BufferVar(&local_230);
  glu::VarType::~VarType(&local_248);
  BufferBlock::setFlags(local_e8,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    BufferBlock::setInstanceName(local_e8,"block");
    BufferBlock::setArraySize(local_e8,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])();
  return;
}

Assistant:

BlockSingleNestedStructCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(&typeS));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_READ));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("t", VarType(&typeT), ACCESS_READ|ACCESS_WRITE));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		init();
	}